

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventDispatcher.cpp
# Opt level: O0

void __thiscall EventDispatcher::sendEventSync(EventDispatcher *this,Event *ev)

{
  uint uVar1;
  undefined1 local_40 [8];
  SyncEventHolder holder;
  Event *ev_local;
  EventDispatcher *this_local;
  
  holder._32_8_ = ev;
  SyncEventHolder::SyncEventHolder((SyncEventHolder *)local_40,ev);
  EventQueue::SendEvent(&this->mQueue,(Event *)local_40);
  (*(this->super_IEventDispatcher)._vptr_IEventDispatcher[0xc])();
  uVar1 = (*(this->super_IEventDispatcher)._vptr_IEventDispatcher[7])();
  if ((uVar1 & 1) != 0) {
    jh_log_print(1,"virtual void EventDispatcher::sendEventSync(Event *)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/EventDispatcher.cpp"
                 ,0xa3,"Sending sync event to your current thread, I will die now...");
  }
  Mutex::Lock(&this->mSyncLock);
  while (((byte)holder.mRealEvent.mObj & 1) == 0) {
    Condition::Wait(&this->mSyncWait,&this->mSyncLock);
  }
  Mutex::Unlock(&this->mSyncLock);
  SyncEventHolder::~SyncEventHolder((SyncEventHolder *)local_40);
  return;
}

Assistant:

void EventDispatcher::sendEventSync( Event *ev )
{
	TRACE_BEGIN( LOG_LVL_NOISE );
	// event ref count handled by holder.
	SyncEventHolder holder( ev );

	mQueue.SendEvent( &holder );
	wakeThread();
	
	if (isThreadCurrent())
		LOG_ERR_FATAL("Sending sync event to your current thread, I will die now...");
	
	mSyncLock.Lock();
	while ( holder.mDone == false )
		mSyncWait.Wait( mSyncLock );
	mSyncLock.Unlock();
}